

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteBuiltin_db_reset_record_cursor(jx9_context *pCtx,int argc,jx9_value **argv)

{
  char *pcVar1;
  unqlite_col *puVar2;
  int iFlag;
  int iBool;
  int nByte;
  SyString sName;
  
  if (argc < 1) {
    pcVar1 = "Missing collection name";
LAB_001168b4:
    jx9_context_throw_error(pCtx,1,pcVar1);
  }
  else {
    pcVar1 = jx9_value_to_string(*argv,&nByte);
    if (nByte < 1) {
      pcVar1 = "Invalid collection name";
      goto LAB_001168b4;
    }
    sName.nByte = nByte;
    sName.zString = pcVar1;
    puVar2 = unqliteCollectionFetch((unqlite_vm *)pCtx->pFunc->pUserData,&sName,iFlag);
    if (puVar2 != (unqlite_col *)0x0) {
      puVar2->nCurid = 0;
      iBool = 1;
      goto LAB_001168c4;
    }
  }
  iBool = 0;
LAB_001168c4:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int unqliteBuiltin_db_reset_record_cursor(jx9_context *pCtx,int argc,jx9_value **argv)
{
	unqlite_col *pCol;
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Fetch the collection */
	pCol = unqliteCollectionFetch(pVm,&sName,UNQLITE_VM_AUTO_LOAD);
	if( pCol ){
		unqliteCollectionResetRecordCursor(pCol);
		jx9_result_bool(pCtx,1);
	}else{
		/* No such collection */
		jx9_result_bool(pCtx,0);
	}
	return JX9_OK;
}